

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Vec_Ptr_t * Abs_ManTernarySimulate(Aig_Man_t *p,int nFramesMax,int fVerbose)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  uint nCap;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p_01;
  void *Entry;
  Aig_Obj_t *pAVar4;
  abctime aVar5;
  abctime clk;
  int nFrameWords;
  int nFramesLimit;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSimInfo;
  int fVerbose_local;
  int nFramesMax_local;
  Aig_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                  ,0xd0,"Vec_Ptr_t *Abs_ManTernarySimulate(Aig_Man_t *, int, int)");
  }
  iVar1 = Aig_ManObjNum(p);
  nCap = Abc_MinInt((int)(800000000 / (long)iVar1) + 1,nFramesMax);
  iVar1 = Aig_ManObjNum(p);
  iVar1 = Abc_BitWordNum(iVar1 << 1);
  p_01 = Vec_PtrAlloc(nCap);
  nFrameWords = 0;
  do {
    if ((int)nCap <= nFrameWords) {
      if (fVerbose != 0) {
        iVar1 = Aig_ManObjNum(p);
        printf("Ternary sim proved all outputs in the first %d frames.  Used %5.2f MB.  ",
               ((double)(int)nCap * 0.25 * (double)iVar1) / 1048576.0,(ulong)nCap);
        Abc_Print(1,"%s =","Time");
        aVar5 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
      }
      return p_01;
    }
    Entry = calloc((long)iVar1,4);
    Vec_PtrPush(p_01,Entry);
    if (nFrameWords == 0) {
      for (nFramesLimit = 0; iVar2 = Saig_ManRegNum(p), nFramesLimit < iVar2;
          nFramesLimit = nFramesLimit + 1) {
        p_00 = p->vCis;
        iVar2 = Saig_ManPiNum(p);
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,nFramesLimit + iVar2);
        Abs_ManSimInfoSet(p_01,pAVar4,0,1);
      }
    }
    pAVar4 = Aig_ManConst1(p);
    Abs_ManSimInfoSet(p_01,pAVar4,nFrameWords,2);
    for (nFramesLimit = 0; iVar2 = Saig_ManPiNum(p), nFramesLimit < iVar2;
        nFramesLimit = nFramesLimit + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,nFramesLimit);
      Abs_ManSimInfoSet(p_01,pAVar4,nFrameWords,3);
    }
    for (nFramesLimit = 0; iVar2 = Saig_ManPoNum(p), nFramesLimit < iVar2;
        nFramesLimit = nFramesLimit + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nFramesLimit);
      Abs_ManExtendOneEval_rec(p_01,p,pAVar4,nFrameWords);
    }
    for (nFramesLimit = 0; iVar2 = Saig_ManPoNum(p), nFramesLimit < iVar2;
        nFramesLimit = nFramesLimit + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nFramesLimit);
      iVar2 = Abs_ManSimInfoGet(p_01,pAVar4,nFrameWords);
      if (iVar2 != 1) {
        if (fVerbose == 0) {
          return p_01;
        }
        iVar1 = Aig_ManObjNum(p);
        printf("Ternary sim found non-zero output in frame %d.  Used %5.2f MB.  ",
               ((double)(nFrameWords + 1) * 0.25 * (double)iVar1) / 1048576.0,
               (ulong)(uint)nFrameWords);
        Abc_Print(1,"%s =","Time");
        aVar5 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
        return p_01;
      }
    }
    nFrameWords = nFrameWords + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abs_ManTernarySimulate( Aig_Man_t * p, int nFramesMax, int fVerbose )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i, f, nFramesLimit, nFrameWords;
    abctime clk = Abc_Clock();
    assert( Aig_ManRegNum(p) > 0 );
    // the maximum number of frames will be determined to use at most 200Mb of RAM
    nFramesLimit = 1 + (200000000 * 4)/Aig_ManObjNum(p);
    nFramesLimit = Abc_MinInt( nFramesLimit, nFramesMax );
    nFrameWords  = Abc_BitWordNum( 2 * Aig_ManObjNum(p) );
    // allocate simulation info
    vSimInfo = Vec_PtrAlloc( nFramesLimit );
    for ( f = 0; f < nFramesLimit; f++ )
    {
        Vec_PtrPush( vSimInfo, ABC_CALLOC(unsigned, nFrameWords) );
        if ( f == 0 ) 
        {
            Saig_ManForEachLo( p, pObj, i )
                Abs_ManSimInfoSet( vSimInfo, pObj, 0, ABS_ZER );
        }
        Abs_ManSimInfoSet( vSimInfo, Aig_ManConst1(p), f, ABS_ONE );
        Saig_ManForEachPi( p, pObj, i )
            Abs_ManSimInfoSet( vSimInfo, pObj, f, ABS_UND );
        Saig_ManForEachPo( p, pObj, i )
            Abs_ManExtendOneEval_rec( vSimInfo, p, pObj, f );
        // check if simulation has derived at least one fail or unknown
        Saig_ManForEachPo( p, pObj, i )
            if ( Abs_ManSimInfoGet(vSimInfo, pObj, f) != ABS_ZER )
            {
                if ( fVerbose )
                {
                    printf( "Ternary sim found non-zero output in frame %d.  Used %5.2f MB.  ", 
                        f, 0.25 * (f+1) * Aig_ManObjNum(p) / (1<<20) );
                    ABC_PRT( "Time", Abc_Clock() - clk );
                }
                return vSimInfo;
            }
    }
    if ( fVerbose )
    {
        printf( "Ternary sim proved all outputs in the first %d frames.  Used %5.2f MB.  ", 
            nFramesLimit, 0.25 * nFramesLimit * Aig_ManObjNum(p) / (1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vSimInfo;
}